

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall Builder::Cleanup(Builder *this)

{
  DiskInterface *pDVar1;
  Status *pSVar2;
  bool bVar3;
  pointer pCVar4;
  reference ppEVar5;
  reference ppNVar6;
  string *psVar7;
  long lVar8;
  undefined8 uVar9;
  TimeStamp TVar10;
  ulong uVar11;
  TimeStamp new_mtime;
  string err;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_70;
  iterator o;
  string depfile;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_40;
  iterator e;
  undefined1 local_28 [8];
  vector<Edge_*,_std::allocator<Edge_*>_> active_edges;
  Builder *this_local;
  
  active_edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  pCVar4 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::get
                     (&this->command_runner_);
  if (pCVar4 != (pointer)0x0) {
    pCVar4 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    (*pCVar4->_vptr_CommandRunner[6])(local_28);
    pCVar4 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    (*pCVar4->_vptr_CommandRunner[7])();
    local_40._M_current =
         (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)local_28);
    while( true ) {
      depfile.field_2._8_8_ =
           std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                     ((vector<Edge_*,_std::allocator<Edge_*>_> *)local_28);
      bVar3 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                          *)((long)&depfile.field_2 + 8));
      if (!bVar3) break;
      ppEVar5 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                ::operator*(&local_40);
      Edge::GetUnescapedDepfile_abi_cxx11_((string *)&o,*ppEVar5);
      ppEVar5 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                ::operator*(&local_40);
      local_70._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar5)->outputs_);
      while( true ) {
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                  operator*(&local_40);
        err.field_2._8_8_ = std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar5)->outputs_)
        ;
        bVar3 = __gnu_cxx::operator!=
                          (&local_70,
                           (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                            *)((long)&err.field_2 + 8));
        if (!bVar3) break;
        std::__cxx11::string::string((string *)&new_mtime);
        pDVar1 = this->disk_interface_;
        ppNVar6 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_70);
        psVar7 = Node::path_abi_cxx11_(*ppNVar6);
        lVar8 = (**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,psVar7,&new_mtime);
        if (lVar8 == -1) {
          pSVar2 = this->status_;
          uVar9 = std::__cxx11::string::c_str();
          (*pSVar2->_vptr_Status[8])(pSVar2,"%s",uVar9);
        }
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
LAB_00111032:
          pDVar1 = this->disk_interface_;
          ppNVar6 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_70);
          psVar7 = Node::path_abi_cxx11_(*ppNVar6);
          (**(code **)(*(long *)pDVar1 + 0x30))(pDVar1,psVar7);
        }
        else {
          ppNVar6 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_70);
          TVar10 = Node::mtime(*ppNVar6);
          if (TVar10 != lVar8) goto LAB_00111032;
        }
        std::__cxx11::string::~string((string *)&new_mtime);
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_70);
      }
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,&o);
      }
      std::__cxx11::string::~string((string *)&o);
      __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
      operator++(&local_40);
    }
    std::vector<Edge_*,_std::allocator<Edge_*>_>::~vector
              ((vector<Edge_*,_std::allocator<Edge_*>_> *)local_28);
  }
  return;
}

Assistant:

void Builder::Cleanup() {
  if (command_runner_.get()) {
    vector<Edge*> active_edges = command_runner_->GetActiveEdges();
    command_runner_->Abort();

    for (vector<Edge*>::iterator e = active_edges.begin();
         e != active_edges.end(); ++e) {
      string depfile = (*e)->GetUnescapedDepfile();
      for (vector<Node*>::iterator o = (*e)->outputs_.begin();
           o != (*e)->outputs_.end(); ++o) {
        // Only delete this output if it was actually modified.  This is
        // important for things like the generator where we don't want to
        // delete the manifest file if we can avoid it.  But if the rule
        // uses a depfile, always delete.  (Consider the case where we
        // need to rebuild an output because of a modified header file
        // mentioned in a depfile, and the command touches its depfile
        // but is interrupted before it touches its output file.)
        string err;
        TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), &err);
        if (new_mtime == -1)  // Log and ignore Stat() errors.
          status_->Error("%s", err.c_str());
        if (!depfile.empty() || (*o)->mtime() != new_mtime)
          disk_interface_->RemoveFile((*o)->path());
      }
      if (!depfile.empty())
        disk_interface_->RemoveFile(depfile);
    }
  }
}